

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_input_pack4_sse
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long *in_RSI;
  long *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  __m128 _r0tm3;
  __m128 _r0tm2;
  __m128 _r0tm1;
  __m128 _r0tm0;
  __m128 _tmp03;
  __m128 _tmp02;
  __m128 _tmp01;
  __m128 _tmp00;
  int m_3;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m128 _tmp3m;
  __m128 _tmp2m;
  __m128 _tmp1m;
  __m128 _tmp0m;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [4] [4] [4];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  int local_67c;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_628;
  undefined8 uStack_620;
  int local_5cc;
  undefined1 (*local_5c8) [16];
  int local_5c0;
  int local_5bc;
  undefined8 local_5b8 [8];
  undefined8 auStack_578 [8];
  undefined8 auStack_538 [8];
  undefined8 auStack_4f8 [10];
  void *local_4a8;
  int *local_4a0;
  ulong local_498;
  undefined4 local_490;
  long *local_488;
  int local_480;
  int local_47c;
  int local_478;
  undefined4 local_474;
  undefined4 local_470;
  ulong local_468;
  void *local_460;
  int *local_458;
  ulong local_450;
  undefined4 local_448;
  long *local_440;
  int local_438;
  int local_434;
  int local_430;
  undefined4 local_42c;
  undefined4 local_428;
  ulong local_420;
  int local_414;
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  long *local_3f0;
  long *local_3e8;
  void **local_3e0;
  void **local_3d0;
  int local_3b0;
  undefined4 local_3ac;
  void **local_3a8;
  int local_390;
  undefined4 local_38c;
  void **local_388;
  undefined1 local_37d;
  int local_37c;
  void **local_370;
  void **local_350;
  int local_344;
  void **local_340;
  undefined1 local_335;
  int local_334;
  void **local_328;
  void *local_2f8;
  void *local_2e8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined1 (*local_1b8) [16];
  undefined1 (*local_1b0) [16];
  undefined1 (*local_1a8) [16];
  undefined1 (*local_1a0) [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  long *local_90;
  undefined4 local_84;
  ulong local_80;
  void *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  void **local_60;
  long *local_58;
  undefined4 local_4c;
  ulong local_48;
  void *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  void **local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_3fc = *(int *)((long)in_RDI + 0x2c);
  local_400 = (int)in_RDI[6];
  local_404 = (int)in_RDI[7];
  local_408 = (local_3fc + -2) / 2;
  local_40c = (local_400 + -2) / 2;
  local_410 = local_408 * local_40c;
  local_3f0 = in_RSI;
  local_3e8 = in_RDI;
  for (local_414 = 0; local_414 < local_404; local_414 = local_414 + 1) {
    local_328 = &local_460;
    local_64 = *(int *)((long)local_3e8 + 0x2c);
    local_68 = (int)local_3e8[6];
    local_6c = *(undefined4 *)((long)local_3e8 + 0x34);
    local_78 = (void *)(*local_3e8 + local_3e8[8] * (long)local_414 * local_3e8[2]);
    local_80 = local_3e8[2];
    local_84 = (undefined4)local_3e8[3];
    local_90 = (long *)local_3e8[4];
    local_60 = &local_460;
    local_460 = local_78;
    local_458 = (int *)0x0;
    local_450 = local_80;
    local_448 = local_84;
    local_440 = local_90;
    local_434 = local_64;
    local_430 = local_68;
    local_42c = 1;
    local_428 = local_6c;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_420 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_80;
    local_438 = (int)local_3e8[5] + -1;
    if ((int)local_3e8[5] == 4) {
      local_420 = (long)*(int *)((long)local_3e8 + 0x2c) * (long)(int)local_3e8[6];
    }
    local_370 = &local_4a8;
    local_2c = *(int *)((long)local_3f0 + 0x2c);
    local_30 = (int)local_3f0[6];
    local_34 = *(undefined4 *)((long)local_3f0 + 0x34);
    local_40 = (void *)(*local_3f0 + local_3f0[8] * (long)local_414 * local_3f0[2]);
    local_48 = local_3f0[2];
    local_4c = (undefined4)local_3f0[3];
    local_58 = (long *)local_3f0[4];
    local_28 = &local_4a8;
    local_4a8 = local_40;
    local_4a0 = (int *)0x0;
    local_498 = local_48;
    local_490 = local_4c;
    local_488 = local_58;
    local_47c = local_2c;
    local_478 = local_30;
    local_474 = 1;
    local_470 = local_34;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_468 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_48;
    local_480 = (int)local_3f0[5] + -1;
    if ((int)local_3f0[5] == 4) {
      local_468 = (long)*(int *)((long)local_3f0 + 0x2c) * (long)(int)local_3f0[6];
    }
    local_c = 0x10;
    local_1c = 0x10;
    local_334 = local_414;
    local_335 = 1;
    local_37c = local_414;
    local_37d = 1;
    for (local_5bc = 0; local_5bc < local_40c; local_5bc = local_5bc + 1) {
      for (local_5c0 = 0; local_5c0 < local_408; local_5c0 = local_5c0 + 1) {
        local_344 = local_5bc << 1;
        local_340 = &local_460;
        local_5c8 = (undefined1 (*) [16])
                    ((long)local_460 +
                    (long)(local_5c0 << 3) * 4 + (long)local_434 * (long)local_344 * local_450);
        for (local_5cc = 0; local_5cc < 4; local_5cc = local_5cc + 1) {
          local_1a0 = local_5c8;
          local_a8 = *(undefined8 *)*local_5c8;
          uStack_a0 = *(undefined8 *)(*local_5c8 + 8);
          local_1a8 = local_5c8 + 1;
          local_f8 = *(undefined8 *)*local_1a8;
          uStack_f0 = *(undefined8 *)(local_5c8[1] + 8);
          local_1b0 = local_5c8 + 2;
          local_c8 = *(undefined8 *)*local_1b0;
          uStack_c0 = *(undefined8 *)(local_5c8[2] + 8);
          local_1b8 = local_5c8 + 3;
          local_e8 = *(undefined8 *)*local_1b8;
          uStack_e0 = *(undefined8 *)(local_5c8[3] + 8);
          auVar1 = vsubps_avx(*local_5c8,*local_1b0);
          local_168._0_4_ = (float)local_f8;
          local_168._4_4_ = (float)((ulong)local_f8 >> 0x20);
          uStack_160._0_4_ = (float)uStack_f0;
          uStack_160._4_4_ = (float)((ulong)uStack_f0 >> 0x20);
          local_178._0_4_ = (float)local_c8;
          local_178._4_4_ = (float)((ulong)local_c8 >> 0x20);
          uStack_170._0_4_ = (float)uStack_c0;
          uStack_170._4_4_ = (float)((ulong)uStack_c0 >> 0x20);
          fVar8 = (float)local_168 + (float)local_178;
          fVar9 = local_168._4_4_ + local_178._4_4_;
          fVar10 = (float)uStack_160 + (float)uStack_170;
          fVar11 = uStack_160._4_4_ + uStack_170._4_4_;
          auVar2 = vsubps_avx(*local_1b0,*local_1a8);
          auVar3 = vsubps_avx(*local_1b8,*local_1a8);
          local_1e0 = local_5b8 + (long)local_5cc * 2;
          local_628 = auVar1._0_8_;
          uStack_620 = auVar1._8_8_;
          local_1f8 = local_628;
          uStack_1f0 = uStack_620;
          local_178 = local_c8;
          uStack_170 = uStack_c0;
          local_168 = local_f8;
          uStack_160 = uStack_f0;
          local_d8 = local_f8;
          uStack_d0 = uStack_f0;
          local_b8 = local_c8;
          uStack_b0 = uStack_c0;
          *local_1e0 = local_628;
          local_5b8[(long)local_5cc * 2 + 1] = uStack_620;
          local_200 = local_5b8 + (long)local_5cc * 2 + 8;
          local_218 = CONCAT44(fVar9,fVar8);
          uVar4 = CONCAT44(fVar11,fVar10);
          uStack_210 = uVar4;
          *local_200 = local_218;
          auStack_538[(long)local_5cc * 2 + -7] = uVar4;
          local_220 = auStack_538 + (long)local_5cc * 2;
          local_648 = auVar2._0_8_;
          uStack_640 = auVar2._8_8_;
          local_238 = local_648;
          uStack_230 = uStack_640;
          *local_220 = local_648;
          auStack_538[(long)local_5cc * 2 + 1] = uStack_640;
          local_240 = auStack_4f8 + (long)local_5cc * 2;
          local_658 = auVar3._0_8_;
          uStack_650 = auVar3._8_8_;
          local_258 = local_658;
          uStack_250 = uStack_650;
          *local_240 = local_658;
          auStack_4f8[(long)local_5cc * 2 + 1] = uStack_650;
          local_5c8 = (undefined1 (*) [16])(*local_5c8 + (long)(local_3fc << 2) * 4);
        }
        local_350 = &local_4a8;
        local_660 = (undefined8 *)
                    ((long)local_4a8 + (long)((local_5bc * local_408 + local_5c0) * 4) * 4);
        local_668 = (undefined8 *)((long)local_660 + (long)(local_410 << 2) * 4);
        local_670 = (undefined8 *)((long)local_660 + (long)(local_410 << 3) * 4);
        local_678 = (undefined8 *)((long)local_660 + (long)(local_410 * 0xc) * 4);
        for (local_67c = 0; local_67c < 4; local_67c = local_67c + 1) {
          local_1c0 = local_5b8 + (long)local_67c * 8;
          local_108 = *local_1c0;
          uStack_100 = local_5b8[(long)local_67c * 8 + 1];
          local_1c8 = local_5b8 + (long)local_67c * 8 + 2;
          local_158 = *local_1c8;
          uStack_150 = local_5b8[(long)local_67c * 8 + 3];
          local_1d0 = local_5b8 + (long)local_67c * 8 + 4;
          local_128 = *local_1d0;
          uStack_120 = local_5b8[(long)local_67c * 8 + 5];
          local_1d8 = local_5b8 + (long)local_67c * 8 + 6;
          local_148 = *local_1d8;
          uStack_140 = local_5b8[(long)local_67c * 8 + 7];
          auVar7._8_8_ = uStack_100;
          auVar7._0_8_ = local_108;
          auVar1._8_8_ = uStack_120;
          auVar1._0_8_ = local_128;
          auVar1 = vsubps_avx(auVar7,auVar1);
          local_188._0_4_ = (float)local_158;
          local_188._4_4_ = (float)((ulong)local_158 >> 0x20);
          uStack_180._0_4_ = (float)uStack_150;
          uStack_180._4_4_ = (float)((ulong)uStack_150 >> 0x20);
          local_198._0_4_ = (float)local_128;
          local_198._4_4_ = (float)((ulong)local_128 >> 0x20);
          uStack_190._0_4_ = (float)uStack_120;
          uStack_190._4_4_ = (float)((ulong)uStack_120 >> 0x20);
          auVar6._8_8_ = uStack_120;
          auVar6._0_8_ = local_128;
          auVar2._8_8_ = uStack_150;
          auVar2._0_8_ = local_158;
          auVar2 = vsubps_avx(auVar6,auVar2);
          auVar5._8_8_ = uStack_140;
          auVar5._0_8_ = local_148;
          auVar3._8_8_ = uStack_150;
          auVar3._0_8_ = local_158;
          auVar3 = vsubps_avx(auVar5,auVar3);
          local_260 = local_660;
          local_6d8 = auVar1._0_8_;
          local_278 = local_6d8;
          uStack_6d0 = auVar1._8_8_;
          uStack_270 = uStack_6d0;
          *local_660 = local_6d8;
          local_660[1] = uStack_6d0;
          local_280 = local_668;
          local_298 = CONCAT44(local_188._4_4_ + local_198._4_4_,(float)local_188 + (float)local_198
                              );
          uStack_290 = CONCAT44(uStack_180._4_4_ + uStack_190._4_4_,
                                (float)uStack_180 + (float)uStack_190);
          *local_668 = local_298;
          local_668[1] = uStack_290;
          local_2a0 = local_670;
          local_6f8 = auVar2._0_8_;
          local_2b8 = local_6f8;
          uStack_6f0 = auVar2._8_8_;
          uStack_2b0 = uStack_6f0;
          *local_670 = local_6f8;
          local_670[1] = uStack_6f0;
          local_2c0 = local_678;
          local_708 = auVar3._0_8_;
          local_2d8 = local_708;
          uStack_700 = auVar3._8_8_;
          uStack_2d0 = uStack_700;
          *local_678 = local_708;
          local_678[1] = uStack_700;
          local_660 = (undefined8 *)((long)local_660 + (long)(local_410 << 4) * 4);
          local_668 = (undefined8 *)((long)local_668 + (long)(local_410 << 4) * 4);
          local_670 = (undefined8 *)((long)local_670 + (long)(local_410 << 4) * 4);
          local_678 = (undefined8 *)((long)local_678 + (long)(local_410 << 4) * 4);
          local_198 = local_128;
          uStack_190 = uStack_120;
          local_188 = local_158;
          uStack_180 = uStack_150;
          local_138 = local_158;
          uStack_130 = uStack_150;
          local_118 = local_128;
          uStack_110 = uStack_120;
        }
      }
    }
    local_3e0 = &local_4a8;
    local_388 = local_3e0;
    if (local_4a0 != (int *)0x0) {
      local_38c = 0xffffffff;
      LOCK();
      local_390 = *local_4a0;
      *local_4a0 = *local_4a0 + -1;
      UNLOCK();
      if (local_390 == 1) {
        if (local_488 == (long *)0x0) {
          local_2f8 = local_4a8;
          if (local_4a8 != (void *)0x0) {
            free(local_4a8);
          }
        }
        else {
          (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
        }
      }
    }
    local_4a8 = (void *)0x0;
    local_498 = 0;
    local_490 = 0;
    local_480 = 0;
    local_47c = 0;
    local_478 = 0;
    local_474 = 0;
    local_470 = 0;
    local_468 = 0;
    local_4a0 = (int *)0x0;
    local_3d0 = &local_460;
    local_3a8 = local_3d0;
    if (local_458 != (int *)0x0) {
      local_3ac = 0xffffffff;
      LOCK();
      local_3b0 = *local_458;
      *local_458 = *local_458 + -1;
      UNLOCK();
      if (local_3b0 == 1) {
        if (local_440 == (long *)0x0) {
          local_2e8 = local_460;
          if (local_460 != (void *)0x0) {
            free(local_460);
          }
        }
        else {
          (**(code **)(*local_440 + 0x18))(local_440,local_460);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_input_pack4_sse(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 2;
    const int h_tiles = (h - 2) / 2;
    const int tiles = w_tiles * h_tiles;

    // const float itm[4][4] = {
    //     {1.0f,  0.0f, -1.0f,  0.0f},
    //     {0.0f,  1.0f,  1.00f, 0.0f},
    //     {0.0f, -1.0f,  1.00f, 0.0f},
    //     {0.0f, -1.0f,  0.00f, 1.0f}
    // };

    // 0 = r00 - r02
    // 1 = r01 + r02
    // 2 = r02 - r01
    // 3 = r03 - r01

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[4][4][4];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 2) + (j * 2) * 4;

                for (int m = 0; m < 4; m++)
                {
                    __m128 _r00 = _mm_load_ps(r0);
                    __m128 _r01 = _mm_load_ps(r0 + 4);
                    __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r03 = _mm_load_ps(r0 + 4 * 3);

                    __m128 _tmp0m = _mm_sub_ps(_r00, _r02);
                    __m128 _tmp1m = _mm_add_ps(_r01, _r02);
                    __m128 _tmp2m = _mm_sub_ps(_r02, _r01);
                    __m128 _tmp3m = _mm_sub_ps(_r03, _r01);

                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[1][m], _tmp1m);
                    _mm_store_ps(tmp[2][m], _tmp2m);
                    _mm_store_ps(tmp[3][m], _tmp3m);

                    r0 += w * 4;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 4;
                float* r0_tm_1 = r0_tm_0 + tiles * 4;
                float* r0_tm_2 = r0_tm_0 + tiles * 4 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 4 * 3;

                for (int m = 0; m < 4; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);

                    __m128 _r0tm0 = _mm_sub_ps(_tmp00, _tmp02);
                    __m128 _r0tm1 = _mm_add_ps(_tmp01, _tmp02);
                    __m128 _r0tm2 = _mm_sub_ps(_tmp02, _tmp01);
                    __m128 _r0tm3 = _mm_sub_ps(_tmp03, _tmp01);

                    _mm_store_ps(r0_tm_0, _r0tm0);
                    _mm_store_ps(r0_tm_1, _r0tm1);
                    _mm_store_ps(r0_tm_2, _r0tm2);
                    _mm_store_ps(r0_tm_3, _r0tm3);

                    r0_tm_0 += tiles * 4 * 4;
                    r0_tm_1 += tiles * 4 * 4;
                    r0_tm_2 += tiles * 4 * 4;
                    r0_tm_3 += tiles * 4 * 4;
                }
            }
        }
    }
}